

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqc.c
# Opt level: O1

OPJ_INT32 opj_mqc_decode(opj_mqc_t *mqc)

{
  byte *pbVar1;
  opj_mqc_state_t **ppoVar2;
  opj_mqc_state_t *poVar3;
  byte *pbVar4;
  OPJ_UINT32 OVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  OPJ_UINT32 OVar9;
  OPJ_UINT32 OVar10;
  
  ppoVar2 = mqc->curctx;
  poVar3 = *ppoVar2;
  uVar8 = poVar3->qeval;
  uVar6 = mqc->c;
  uVar7 = mqc->a - uVar8;
  mqc->a = uVar7;
  if (uVar6 >> 0x10 < uVar8) {
    mqc->a = uVar8;
    OVar5 = 1 - poVar3->mps;
    if (uVar8 > uVar7) {
      OVar5 = poVar3->mps;
    }
    *ppoVar2 = (&poVar3->nmps)[uVar8 <= uVar7];
    uVar8 = mqc->a;
    OVar9 = mqc->ct;
    do {
      if (OVar9 == 0) {
        pbVar4 = mqc->bp;
        if (pbVar4 == mqc->end) {
LAB_0011c914:
          uVar6 = uVar6 + 0xff00;
LAB_0011c91a:
          OVar9 = 8;
        }
        else {
          pbVar1 = pbVar4 + 1;
          if (pbVar1 == mqc->end) {
            uVar7 = 0xff;
          }
          else {
            uVar7 = (uint)*pbVar1;
          }
          if (*pbVar4 != 0xff) {
            mqc->bp = pbVar1;
            uVar6 = uVar6 + uVar7 * 0x100;
            goto LAB_0011c91a;
          }
          if (0x8f < uVar7) goto LAB_0011c914;
          mqc->bp = pbVar1;
          uVar6 = uVar6 + uVar7 * 0x200;
          OVar9 = 7;
        }
        mqc->c = uVar6;
        mqc->ct = OVar9;
      }
      uVar8 = uVar8 * 2;
      mqc->a = uVar8;
      uVar6 = uVar6 * 2;
      mqc->c = uVar6;
      OVar9 = OVar9 - 1;
      mqc->ct = OVar9;
    } while (uVar8 < 0x8000);
  }
  else {
    OVar9 = uVar6 + uVar8 * -0x10000;
    mqc->c = OVar9;
    if ((short)uVar7 < 0) {
      OVar5 = poVar3->mps;
    }
    else {
      OVar5 = 1 - poVar3->mps;
      if (uVar7 >= uVar8) {
        OVar5 = poVar3->mps;
      }
      *ppoVar2 = (&poVar3->nmps)[uVar7 < uVar8];
      OVar10 = mqc->ct;
      do {
        if (OVar10 == 0) {
          pbVar4 = mqc->bp;
          if (pbVar4 == mqc->end) {
LAB_0011c9c5:
            OVar9 = OVar9 + 0xff00;
LAB_0011c9cb:
            OVar10 = 8;
          }
          else {
            pbVar1 = pbVar4 + 1;
            if (pbVar1 == mqc->end) {
              uVar8 = 0xff;
            }
            else {
              uVar8 = (uint)*pbVar1;
            }
            if (*pbVar4 != 0xff) {
              mqc->bp = pbVar1;
              OVar9 = OVar9 + uVar8 * 0x100;
              goto LAB_0011c9cb;
            }
            if (0x8f < uVar8) goto LAB_0011c9c5;
            mqc->bp = pbVar1;
            OVar9 = OVar9 + uVar8 * 0x200;
            OVar10 = 7;
          }
          mqc->c = OVar9;
          mqc->ct = OVar10;
        }
        uVar7 = uVar7 * 2;
        mqc->a = uVar7;
        OVar9 = OVar9 * 2;
        mqc->c = OVar9;
        OVar10 = OVar10 - 1;
        mqc->ct = OVar10;
      } while (uVar7 < 0x8000);
    }
  }
  return OVar5;
}

Assistant:

OPJ_INT32 opj_mqc_decode(opj_mqc_t *const mqc) {
	OPJ_INT32 d;
	mqc->a -= (*mqc->curctx)->qeval;
	if ((mqc->c >> 16) < (*mqc->curctx)->qeval) {
		d = opj_mqc_lpsexchange(mqc);
		opj_mqc_renormd(mqc);
	} else {
		mqc->c -= (*mqc->curctx)->qeval << 16;
		if ((mqc->a & 0x8000) == 0) {
			d = opj_mqc_mpsexchange(mqc);
			opj_mqc_renormd(mqc);
		} else {
			d = (OPJ_INT32)(*mqc->curctx)->mps;
		}
	}

	return d;
}